

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

int NULLC::CompareObjects(NULLCRef l,NULLCRef r)

{
  int iVar1;
  ExternTypeInfo *pEVar2;
  char *pcVar3;
  char *pcVar4;
  FastVector<char,_false,_false> *pFVar5;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_0000001c;
  uint local_c;
  
  if (in_stack_00000008 == l.ptr._4_4_) {
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    iVar1 = memcmp((void *)CONCAT44(l.typeID,in_stack_0000000c),
                   (void *)CONCAT44(r.typeID,in_stack_0000001c),(ulong)pEVar2->size);
    local_c = (uint)(iVar1 == 0);
  }
  else {
    pFVar5 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),l.ptr._4_4_);
    pcVar3 = FastVector<char,_false,_false>::operator[](pFVar5,pEVar2->offsetToName);
    pFVar5 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    pcVar4 = FastVector<char,_false,_false>::operator[](pFVar5,pEVar2->offsetToName);
    nullcThrowError("ERROR: types don\'t match (%s ref, %s ref)",pcVar3,pcVar4);
    local_c = 0;
  }
  return local_c;
}

Assistant:

int NULLC::CompareObjects(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: types don't match (%s ref, %s ref)", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return 0;
	}
	return 0 == memcmp(l.ptr, r.ptr, linker->exTypes[l.typeID].size);
}